

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int finish_chunk(spng_ctx *ctx)

{
  uchar *puVar1;
  uint32_t uVar2;
  int iVar3;
  uint local_40;
  int ret;
  uint32_t len;
  uint32_t bytes_left;
  uchar *ptr;
  uchar *chunk_data;
  uchar *header;
  spng_chunk *chunk;
  spng_ctx *ctx_local;
  
  if (ctx == (spng_ctx *)0x0) {
    return 0x50;
  }
  if ((*(ushort *)&ctx->field_0xcc & 1) == 0) {
    puVar1 = ctx->write_ptr;
    chunk_data = ctx->write_ptr;
  }
  else {
    puVar1 = ctx->stream_buf;
    chunk_data = ctx->stream_buf;
  }
  ptr = puVar1 + 8;
  write_u32(chunk_data,(ctx->current_chunk).length);
  *(undefined4 *)(chunk_data + 4) = *(undefined4 *)(ctx->current_chunk).type;
  uVar2 = crc32((ctx->current_chunk).crc,ptr,(ctx->current_chunk).length);
  (ctx->current_chunk).crc = uVar2;
  write_u32(ptr + (ctx->current_chunk).length,(ctx->current_chunk).crc);
  if ((*(ushort *)&ctx->field_0xcc & 1) == 0) {
    ctx->bytes_encoded = (ulong)(ctx->current_chunk).length + ctx->bytes_encoded;
    if (ctx->bytes_encoded < (ulong)(ctx->current_chunk).length) {
      return 3;
    }
    ctx->bytes_encoded = ctx->bytes_encoded + 0xc;
    if (ctx->bytes_encoded < 0xc) {
      return 3;
    }
    ctx->write_ptr = ctx->write_ptr + ((ctx->current_chunk).length + 0xc);
  }
  else {
    _len = ctx->stream_buf;
    local_40 = 0;
    for (ret = (ctx->current_chunk).length + 0xc; ret != 0; ret = ret - local_40) {
      _len = _len + local_40;
      local_40 = 0x2000;
      if ((uint)ret < 0x2000) {
        local_40 = ret;
      }
      iVar3 = write_data(ctx,_len,(ulong)local_40);
      if (iVar3 != 0) {
        return iVar3;
      }
    }
  }
  return 0;
}

Assistant:

static int finish_chunk(spng_ctx *ctx)
{
    if(ctx == NULL) return SPNG_EINTERNAL;

    struct spng_chunk *chunk = &ctx->current_chunk;

    unsigned char *header;
    unsigned char *chunk_data;

    if(ctx->streaming)
    {
        chunk_data = ctx->stream_buf + 8;
        header = ctx->stream_buf;
    }
    else
    {
        chunk_data = ctx->write_ptr + 8;
        header = ctx->write_ptr;
    }

    write_u32(header, chunk->length);
    memcpy(header + 4, chunk->type, 4);

    chunk->crc = crc32(chunk->crc, chunk_data, chunk->length);

    write_u32(chunk_data + chunk->length, chunk->crc);

    if(ctx->streaming)
    {
        const unsigned char *ptr = ctx->stream_buf;
        uint32_t bytes_left = chunk->length + 12;
        uint32_t len = 0;

        while(bytes_left)
        {
            ptr += len;
            len = SPNG_WRITE_SIZE;

            if(len > bytes_left) len = bytes_left;

            int ret = write_data(ctx, ptr, len);
            if(ret) return ret;

            bytes_left -= len;
        }
    }
    else
    {
        ctx->bytes_encoded += chunk->length;
        if(ctx->bytes_encoded < chunk->length) return SPNG_EOVERFLOW;

        ctx->bytes_encoded += 12;
        if(ctx->bytes_encoded < 12) return SPNG_EOVERFLOW;

        ctx->write_ptr += chunk->length + 12;
    }

    return 0;
}